

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Aggregate_State_PDU::Decode
          (Aggregate_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 *pKVar1;
  KUINT16 *pKVar2;
  KUINT32 *T;
  pointer pAVar3;
  pointer pAVar4;
  pointer pEVar5;
  pointer pEVar6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  pointer pSVar10;
  pointer pKVar11;
  pointer pKVar12;
  KUINT16 KVar13;
  ushort uVar14;
  uint uVar15;
  VariableDatum *pVVar16;
  KException *this_00;
  ushort uVar17;
  pointer pAVar18;
  pointer pEVar19;
  pointer pSVar20;
  pointer pSVar21;
  pointer pKVar22;
  KUINT32 datumID;
  KUINT8 ui8Padding;
  uint local_7c;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [2];
  KUINT16 *local_40;
  KUINT16 *local_38;
  
  this->m_bNeedsPadding = false;
  this->m_ui16NumberOfPaddingOctets = 0;
  pAVar3 = (this->m_vAI).
           super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = (this->m_vAI).
           super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar18 = pAVar3;
  if (pAVar4 != pAVar3) {
    do {
      (**(pAVar18->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase)(pAVar18);
      pAVar18 = pAVar18 + 1;
    } while (pAVar18 != pAVar4);
    (this->m_vAI).
    super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar3;
  }
  pEVar5 = (this->m_vEI).
           super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (this->m_vEI).
           super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar19 = pEVar5;
  if (pEVar6 != pEVar5) {
    do {
      (**(pEVar19->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase)(pEVar19);
      pEVar19 = pEVar19 + 1;
    } while (pEVar19 != pEVar6);
    (this->m_vEI).
    super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar5;
  }
  pSVar7 = (this->m_vSASL).
           super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar8 = (this->m_vSASL).
           super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar20 = pSVar7;
  if (pSVar8 != pSVar7) {
    do {
      (**(pSVar20->super_DataTypeBase)._vptr_DataTypeBase)(pSVar20);
      pSVar20 = pSVar20 + 1;
    } while (pSVar20 != pSVar8);
    (this->m_vSASL).
    super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar7;
  }
  pSVar9 = (this->m_vSESL).
           super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (this->m_vSESL).
            super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pSVar21 = pSVar9;
  if (pSVar10 != pSVar9) {
    do {
      (**(pSVar21->super_DataTypeBase)._vptr_DataTypeBase)(pSVar21);
      pSVar21 = pSVar21 + 1;
    } while (pSVar21 != pSVar10);
    (this->m_vSESL).
    super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar9;
  }
  pKVar11 = (this->m_vVD).
            super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pKVar12 = (this->m_vVD).
            super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pKVar22 = pKVar11;
  if (pKVar12 != pKVar11) {
    do {
      (**pKVar22->_vptr_KRef_Ptr)(pKVar22);
      pKVar22 = pKVar22 + 1;
    } while (pKVar22 != pKVar12);
    (this->m_vVD).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar11;
  }
  this->m_ui32NumVariableDatum = 0;
  this->m_ui16NumAggregates = 0;
  this->m_ui16NumEntities = 0;
  this->m_ui16NumSilentAggregateTypes = 0;
  this->m_ui16NumSilentEntityTypes = 0;
  KVar13 = KDataStream::GetBufferSize(stream);
  uVar15 = KVar13 + 0xc;
  if (!ignoreHeader) {
    uVar15 = (uint)KVar13;
  }
  if (uVar15 < 0x88) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_78._0_8_ = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Decode","");
    KException::KException(this_00,(KString *)local_78,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = &this->m_ui16NumAggregates;
  pKVar2 = &this->m_ui16NumEntities;
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_AggregateID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_AggregateID,stream);
  KDataStream::Read(stream,&this->m_ui8ForceID);
  KDataStream::Read(stream,&this->m_ui8AggState);
  (*(this->m_AggregateType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AggregateType,stream)
  ;
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32Formation);
  (*(this->m_AggregateMarking).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_AggregateMarking,stream);
  (*(this->m_Dimensions).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Dimensions,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
  (*(this->m_CtrOfMassLoc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_CtrOfMassLoc,stream);
  (*(this->m_Vel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Vel,stream);
  KDataStream::Read<unsigned_short>(stream,pKVar1);
  KDataStream::Read<unsigned_short>(stream,pKVar2);
  local_40 = &this->m_ui16NumSilentAggregateTypes;
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumSilentAggregateTypes);
  local_38 = &this->m_ui16NumSilentEntityTypes;
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumSilentEntityTypes);
  uVar14 = (this->m_ui16NumEntities + this->m_ui16NumAggregates) * 2 & 2;
  this->m_ui16NumberOfPaddingOctets = uVar14;
  if ((uVar14 != 0) &&
     (local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00, this->m_ui16NumberOfPaddingOctets != 0))
  {
    uVar14 = 0;
    do {
      KDataStream::Read(stream,local_78);
      uVar14 = uVar14 + 1;
    } while (uVar14 < this->m_ui16NumberOfPaddingOctets);
  }
  if (*pKVar1 != 0) {
    uVar14 = 0;
    do {
      DATA_TYPE::AggregateIdentifier::AggregateIdentifier((AggregateIdentifier *)local_78,stream);
      std::
      vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
      ::emplace_back<KDIS::DATA_TYPE::AggregateIdentifier>
                (&this->m_vAI,(AggregateIdentifier *)local_78);
      DATA_TYPE::AggregateIdentifier::~AggregateIdentifier((AggregateIdentifier *)local_78);
      uVar14 = uVar14 + 1;
    } while (uVar14 < *pKVar1);
  }
  uVar14 = *pKVar2;
  if (uVar14 != 0) {
    uVar17 = 0;
    do {
      DATA_TYPE::EntityIdentifier::EntityIdentifier((EntityIdentifier *)local_78,stream);
      std::
      vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
      ::emplace_back<KDIS::DATA_TYPE::EntityIdentifier>(&this->m_vEI,(EntityIdentifier *)local_78);
      DATA_TYPE::EntityIdentifier::~EntityIdentifier((EntityIdentifier *)local_78);
      uVar17 = uVar17 + 1;
      uVar14 = *pKVar2;
    } while (uVar17 < uVar14);
  }
  pKVar1 = local_38;
  this->m_ui16NumberOfPaddingOctets = (uVar14 + this->m_ui16NumAggregates) * 2 & 2;
  if (this->m_bNeedsPadding != false) {
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
  }
  pKVar2 = local_40;
  if (*local_40 != 0) {
    uVar14 = 0;
    do {
      DATA_TYPE::SilentAggregateSystem::SilentAggregateSystem
                ((SilentAggregateSystem *)local_78,stream);
      std::
      vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
      ::emplace_back<KDIS::DATA_TYPE::SilentAggregateSystem>
                (&this->m_vSASL,(SilentAggregateSystem *)local_78);
      DATA_TYPE::SilentAggregateSystem::~SilentAggregateSystem((SilentAggregateSystem *)local_78);
      uVar14 = uVar14 + 1;
    } while (uVar14 < *pKVar2);
  }
  if (*pKVar1 != 0) {
    uVar14 = 0;
    do {
      DATA_TYPE::SilentEntitySystem::SilentEntitySystem((SilentEntitySystem *)local_78,stream);
      std::
      vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
      ::emplace_back<KDIS::DATA_TYPE::SilentEntitySystem>
                (&this->m_vSESL,(SilentEntitySystem *)local_78);
      DATA_TYPE::SilentEntitySystem::~SilentEntitySystem((SilentEntitySystem *)local_78);
      uVar14 = uVar14 + 1;
    } while (uVar14 < *pKVar1);
  }
  T = &this->m_ui32NumVariableDatum;
  KDataStream::Read<unsigned_int>(stream,T);
  if (*T != 0) {
    uVar14 = 1;
    do {
      KVar13 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&local_7c);
      KDataStream::SetCurrentWritePosition(stream,KVar13);
      pVVar16 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableDatum>::FactoryDecode
                          (local_7c,stream);
      if (pVVar16 == (VariableDatum *)0x0) {
        pVVar16 = (VariableDatum *)operator_new(0x28);
        DATA_TYPE::VariableDatum::VariableDatum(pVVar16,stream);
        local_78._0_8_ = &PTR__KRef_Ptr_00222930;
        local_78._8_8_ = pVVar16;
        local_68[0]._0_8_ = operator_new(2);
        *(undefined2 *)local_68[0]._0_8_ = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
                    *)&this->m_vVD,(KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)local_78);
      }
      else {
        local_78._0_8_ = &PTR__KRef_Ptr_00222930;
        local_78._8_8_ = pVVar16;
        local_68[0]._0_8_ = operator_new(2);
        *(undefined2 *)local_68[0]._0_8_ = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
                    *)&this->m_vVD,(KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)local_78);
      }
      local_78._0_8_ = &PTR__KRef_Ptr_00222930;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)local_78);
      uVar15 = (uint)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar15 < *T);
  }
  return;
}

Assistant:

void Aggregate_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    m_bNeedsPadding = false;
    m_ui16NumberOfPaddingOctets = 0;
    m_vAI.clear();
    m_vEI.clear();
    m_vSASL.clear();
    m_vSESL.clear();
    m_vVD.clear();
    m_ui16NumAggregates = 0;
    m_ui16NumEntities = 0;
    m_ui16NumSilentAggregateTypes = 0;
    m_ui16NumSilentEntityTypes = 0;
    m_ui32NumVariableDatum = 0;

    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < AGGREGATE_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_AggregateID
           >> m_ui8ForceID
           >> m_ui8AggState
           >> KDIS_STREAM m_AggregateType
           >> m_ui32Formation
           >> KDIS_STREAM m_AggregateMarking
           >> KDIS_STREAM m_Dimensions
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_CtrOfMassLoc
           >> KDIS_STREAM m_Vel
           >> m_ui16NumAggregates
           >> m_ui16NumEntities
           >> m_ui16NumSilentAggregateTypes
           >> m_ui16NumSilentEntityTypes;

    // Does the PDU contain padding?
    calcPadding();

    if( needsPadding() )
    {
        KUINT8 ui8Padding = 0;
        for( KUINT16 p = 0; p < m_ui16NumberOfPaddingOctets; ++p )
        {
            stream >> ui8Padding;
        }
    }

    for( KUINT16 i = 0; i < m_ui16NumAggregates; ++i )
    {
        m_vAI.push_back( AggregateIdentifier( stream ) );
    }

    for( KUINT16 j = 0; j < m_ui16NumEntities; ++j )
    {
        m_vEI.push_back( EntityIdentifier( stream ) );
    }

    // Does the PDU contain padding?
    calcPadding();

    if( m_bNeedsPadding )
    {
        stream >> m_ui16Padding1;
    }

    for( KUINT16 k = 0; k < m_ui16NumSilentAggregateTypes; ++k )
    {
        m_vSASL.push_back( SilentAggregateSystem( stream ) );
    }

    for( KUINT16 l = 0; l < m_ui16NumSilentEntityTypes; ++l )
    {
        m_vSESL.push_back( SilentEntitySystem( stream ) );
    }

    stream >> m_ui32NumVariableDatum;

    // VariableDatum
    for( KUINT16 n = 0; n < m_ui32NumVariableDatum; ++n )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableDatum * p = VariableDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVD.push_back( VarDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vVD.push_back( VarDtmPtr( new VariableDatum( stream ) ) );
        }
    }
}